

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O2

char * getVarName(char *suffixFormula,int startLoc,int *endLocation)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  lVar7 = (long)startLoc;
  uVar4 = (ulong)(byte)suffixFormula[lVar7];
  if ((uVar4 < 0x3b) && ((0x400000100000601U >> (uVar4 & 0x3f) & 1) != 0)) {
    pcVar3 = (char *)0x0;
  }
  else {
    uVar6 = 0;
    while ((0x3a < (byte)uVar4 || ((0x400000100000601U >> (uVar4 & 0x3f) & 1) == 0))) {
      lVar2 = uVar6 + lVar7 + 1;
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)(byte)suffixFormula[lVar2];
    }
    iVar1 = (int)uVar6;
    *endLocation = startLoc + iVar1;
    pcVar3 = (char *)malloc((long)(iVar1 + 1));
    uVar5 = 0;
    uVar4 = uVar6 & 0xffffffff;
    if (iVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pcVar3[uVar5] = suffixFormula[uVar5 + lVar7];
    }
    pcVar3[uVar4] = '\0';
  }
  return pcVar3;
}

Assistant:

char *getVarName( char *suffixFormula, int startLoc, int *endLocation )
{
	int i = startLoc, length;
	char *name;

	if( isNotVarNameSymbol( suffixFormula[startLoc] ) )
		return NULL;

	while( !isNotVarNameSymbol( suffixFormula[i] ) )
		i++;
	*endLocation = i;
	length = i - startLoc;
	name = (char *)malloc( sizeof(char) * (length + 1));
	for( i=0; i<length; i++ )
		name[i] = suffixFormula[i+startLoc];
	name[i] = '\0';

	return name;
}